

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O2

curl_header * curl_easy_nextheader(CURL_conflict *easy,uint type,int request,curl_header *prev)

{
  void *pvVar1;
  Curl_llist_element *pCVar2;
  void *pvVar3;
  int iVar4;
  curl_header *h;
  Curl_llist *pCVar5;
  size_t sVar6;
  int iVar7;
  Curl_llist_element *pCVar8;
  size_t local_48;
  
  iVar7 = (easy->state).requests;
  if (request <= iVar7) {
    if (request != -1) {
      iVar7 = request;
    }
    if (prev == (curl_header *)0x0) {
      pCVar5 = &(easy->state).httphdrs;
    }
    else {
      if (prev->anchor == (void *)0x0) {
        return (curl_header *)0x0;
      }
      pCVar5 = (Curl_llist *)((long)prev->anchor + 0x10);
    }
    pCVar8 = pCVar5->head;
    if (pCVar8 != (Curl_llist_element *)0x0) {
      while ((pvVar1 = pCVar8->ptr, (*(byte *)((long)pvVar1 + 0x2c) & type) == 0 ||
             (*(int *)((long)pvVar1 + 0x28) != iVar7))) {
        pCVar8 = pCVar8->next;
        if (pCVar8 == (Curl_llist_element *)0x0) {
          return (curl_header *)0x0;
        }
      }
      pCVar5 = &(easy->state).httphdrs;
      local_48 = 0;
      sVar6 = 0;
      while( true ) {
        pCVar2 = pCVar5->head;
        if (pCVar2 == (Curl_llist_element *)0x0) break;
        pvVar3 = pCVar2->ptr;
        iVar4 = curl_strequal(*(char **)((long)pvVar1 + 0x18),*(char **)((long)pvVar3 + 0x18));
        if ((iVar4 != 0) && (*(int *)((long)pvVar3 + 0x28) == iVar7)) {
          local_48 = (local_48 + 1) - (ulong)((*(byte *)((long)pvVar3 + 0x2c) & type) == 0);
        }
        if (pCVar2 == pCVar8) {
          sVar6 = local_48 - 1;
        }
        pCVar5 = (Curl_llist *)&pCVar2->next;
      }
      (easy->state).headerout[1].name = *(char **)((long)pvVar1 + 0x18);
      (easy->state).headerout[1].value = *(char **)((long)pvVar1 + 0x20);
      (easy->state).headerout[1].amount = local_48;
      (easy->state).headerout[1].index = sVar6;
      (easy->state).headerout[1].origin = *(byte *)((long)pvVar1 + 0x2c) | 0x8000000;
      (easy->state).headerout[1].anchor = pCVar8;
      return (easy->state).headerout + 1;
    }
  }
  return (curl_header *)0x0;
}

Assistant:

struct curl_header *curl_easy_nextheader(CURL *easy,
                                         unsigned int type,
                                         int request,
                                         struct curl_header *prev)
{
  struct Curl_easy *data = easy;
  struct Curl_llist_element *pick;
  struct Curl_llist_element *e;
  struct Curl_header_store *hs;
  size_t amount = 0;
  size_t index = 0;

  if(request > data->state.requests)
    return NULL;
  if(request == -1)
    request = data->state.requests;

  if(prev) {
    pick = prev->anchor;
    if(!pick)
      /* something is wrong */
      return NULL;
    pick = pick->next;
  }
  else
    pick = data->state.httphdrs.head;

  if(pick) {
    /* make sure it is the next header of the desired type */
    do {
      hs = pick->ptr;
      if((hs->type & type) && (hs->request == request))
        break;
      pick = pick->next;
    } while(pick);
  }

  if(!pick)
    /* no more headers available */
    return NULL;

  hs = pick->ptr;

  /* count number of occurrences of this name within the mask and figure out
     the index for the currently selected entry */
  for(e = data->state.httphdrs.head; e; e = e->next) {
    struct Curl_header_store *check = e->ptr;
    if(strcasecompare(hs->name, check->name) &&
       (check->request == request) &&
       (check->type & type))
      amount++;
    if(e == pick)
      index = amount - 1;
  }

  copy_header_external(hs, index, amount, pick,
                       &data->state.headerout[1]);
  return &data->state.headerout[1];
}